

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall HighsDomain::markPropagate(HighsDomain *this,HighsInt row)

{
  double dVar1;
  HighsMipSolver *pHVar2;
  pointer pHVar3;
  iterator __position;
  bool bVar4;
  bool bVar5;
  HighsInt local_c;
  
  if ((this->propagateflags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[row] == '\0') {
    pHVar2 = this->mipsolver;
    dVar1 = (pHVar2->model_->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start[row];
    if ((dVar1 <= -INFINITY) ||
       (((this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[row] == 0 &&
        (pHVar3 = (this->activitymin_).
                  super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start,
        dVar1 - ((pHVar2->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol <=
        pHVar3[row].hi + pHVar3[row].lo)))) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if ((this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row] != 1) {
        pHVar3 = (this->activitymax_).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar4 = (pHVar3[row].hi + pHVar3[row].lo) - dVar1 <=
                (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[row];
      }
    }
    dVar1 = (pHVar2->model_->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start[row];
    if ((INFINITY <= dVar1) ||
       (((this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[row] == 0 &&
        (pHVar3 = (this->activitymax_).
                  super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start,
        pHVar3[row].hi + pHVar3[row].lo <=
        ((pHVar2->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol + dVar1)))) {
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if ((this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row] != 1) {
        pHVar3 = (this->activitymin_).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar5 = dVar1 - (pHVar3[row].hi + pHVar3[row].lo) <=
                (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[row];
      }
    }
    if ((bool)(bVar4 | bVar5)) {
      __position._M_current =
           (this->propagateinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_c = row;
      if (__position._M_current ==
          (this->propagateinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->propagateinds_,__position,&local_c);
      }
      else {
        *__position._M_current = row;
        (this->propagateinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      (this->propagateflags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[local_c] = '\x01';
    }
  }
  return;
}

Assistant:

void HighsDomain::markPropagate(HighsInt row) {
  if (!propagateflags_[row]) {
    bool proplower = mipsolver->rowLower(row) != -kHighsInf &&
                     (activitymininf_[row] != 0 ||
                      activitymin_[row] < mipsolver->rowLower(row) -
                                              mipsolver->mipdata_->feastol) &&
                     (activitymaxinf_[row] == 1 ||
                      (double(activitymax_[row]) - mipsolver->rowLower(row)) <=
                          capacityThreshold_[row]);
    bool propupper = mipsolver->rowUpper(row) != kHighsInf &&
                     (activitymaxinf_[row] != 0 ||
                      activitymax_[row] > mipsolver->rowUpper(row) +
                                              mipsolver->mipdata_->feastol) &&
                     (activitymininf_[row] == 1 ||
                      (mipsolver->rowUpper(row) - double(activitymin_[row])) <=
                          capacityThreshold_[row]);

    if (proplower || propupper) {
      propagateinds_.push_back(row);
      propagateflags_[row] = 1;
    }
  }
}